

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_strength_solver_fit_piecewise
              (aom_noise_strength_solver_t *solver,int max_output_points,
              aom_noise_strength_lut_t *lut)

{
  double dVar1;
  int iVar2;
  void *__s;
  long *in_RDX;
  int in_ESI;
  aom_noise_strength_solver_t *in_RDI;
  double dVar3;
  int num_remaining;
  double avg_residual;
  double dx;
  int j;
  int min_index;
  double *residual;
  int i;
  double kTolerance;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  int local_40;
  int local_3c;
  int local_2c;
  int local_14;
  int local_4;
  
  dVar1 = in_RDI->max_intensity;
  iVar2 = aom_noise_strength_lut_init
                    ((aom_noise_strength_lut_t *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  if (iVar2 == 0) {
    fprintf(_stderr,"Failed to init lut\n");
    local_4 = 0;
  }
  else {
    for (local_2c = 0; local_2c < in_RDI->num_bins; local_2c = local_2c + 1) {
      dVar3 = aom_noise_strength_solver_get_center(in_RDI,local_2c);
      *(double *)(*in_RDX + (long)local_2c * 0x10) = dVar3;
      *(double *)(*in_RDX + (long)local_2c * 0x10 + 8) = (in_RDI->eqns).x[local_2c];
    }
    local_14 = in_ESI;
    if (in_ESI < 0) {
      local_14 = in_RDI->num_bins;
    }
    __s = aom_malloc(0xa3f53c);
    if (__s == (void *)0x0) {
      aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0xa3f553);
      local_4 = 0;
    }
    else {
      memset(__s,0,(long)in_RDI->num_bins << 3);
      update_piecewise_linear_residual
                ((aom_noise_strength_solver_t *)residual,_j,(double *)dx,avg_residual._4_4_,
                 avg_residual._0_4_);
      while (2 < (int)in_RDX[1]) {
        local_3c = 1;
        for (local_40 = 1; local_40 < (int)in_RDX[1] + -1; local_40 = local_40 + 1) {
          if (*(double *)((long)__s + (long)local_40 * 8) <
              *(double *)((long)__s + (long)local_3c * 8)) {
            local_3c = local_40;
          }
        }
        in_stack_ffffffffffffffb0 =
             (void *)(*(double *)((long)__s + (long)local_3c * 8) /
                     (*(double *)(*in_RDX + (long)(local_3c + 1) * 0x10) -
                     *(double *)(*in_RDX + (long)(local_3c + -1) * 0x10)));
        if (((int)in_RDX[1] <= local_14) &&
           ((dVar1 * 0.00625) / 255.0 < (double)in_stack_ffffffffffffffb0)) break;
        memmove((void *)(*in_RDX + (long)local_3c * 0x10),
                (void *)(*in_RDX + (long)local_3c * 0x10 + 0x10),
                (long)(((int)in_RDX[1] - local_3c) + -1) << 4);
        *(int *)(in_RDX + 1) = (int)in_RDX[1] + -1;
        update_piecewise_linear_residual
                  ((aom_noise_strength_solver_t *)residual,_j,(double *)dx,avg_residual._4_4_,
                   avg_residual._0_4_);
      }
      aom_free(in_stack_ffffffffffffffb0);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int aom_noise_strength_solver_fit_piecewise(
    const aom_noise_strength_solver_t *solver, int max_output_points,
    aom_noise_strength_lut_t *lut) {
  // The tolerance is normalized to be give consistent results between
  // different bit-depths.
  const double kTolerance = solver->max_intensity * 0.00625 / 255.0;
  if (!aom_noise_strength_lut_init(lut, solver->num_bins)) {
    fprintf(stderr, "Failed to init lut\n");
    return 0;
  }
  for (int i = 0; i < solver->num_bins; ++i) {
    lut->points[i][0] = aom_noise_strength_solver_get_center(solver, i);
    lut->points[i][1] = solver->eqns.x[i];
  }
  if (max_output_points < 0) {
    max_output_points = solver->num_bins;
  }

  double *residual = (double *)aom_malloc(solver->num_bins * sizeof(*residual));
  if (!residual) {
    aom_noise_strength_lut_free(lut);
    return 0;
  }
  memset(residual, 0, sizeof(*residual) * solver->num_bins);

  update_piecewise_linear_residual(solver, lut, residual, 0, solver->num_bins);

  // Greedily remove points if there are too many or if it doesn't hurt local
  // approximation (never remove the end points)
  while (lut->num_points > 2) {
    int min_index = 1;
    for (int j = 1; j < lut->num_points - 1; ++j) {
      if (residual[j] < residual[min_index]) {
        min_index = j;
      }
    }
    const double dx =
        lut->points[min_index + 1][0] - lut->points[min_index - 1][0];
    const double avg_residual = residual[min_index] / dx;
    if (lut->num_points <= max_output_points && avg_residual > kTolerance) {
      break;
    }

    const int num_remaining = lut->num_points - min_index - 1;
    memmove(lut->points + min_index, lut->points + min_index + 1,
            sizeof(lut->points[0]) * num_remaining);
    lut->num_points--;

    update_piecewise_linear_residual(solver, lut, residual, min_index - 1,
                                     min_index + 1);
  }
  aom_free(residual);
  return 1;
}